

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaDemuxer.cpp
# Opt level: O1

int __thiscall MatroskaDemuxer::ebml_read_header(MatroskaDemuxer *this,char **doctype,int *version)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 *puVar4;
  int unaff_R13D;
  uint32_t id;
  int levelUp;
  int64_t num;
  uint32_t id_1;
  uint32_t local_238;
  int local_234;
  long local_230;
  uint *local_228;
  undefined8 local_220;
  uint local_218;
  undefined4 uStack_214;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  uint *local_208;
  undefined8 local_200;
  uint local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  uint *local_1e8;
  undefined8 local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  uint *local_1c8;
  undefined8 local_1c0;
  uint local_1b8;
  undefined4 uStack_1b4;
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined8 local_1a8;
  
  if (doctype != (char **)0x0) {
    *doctype = (char *)0x0;
  }
  if (version != (int *)0x0) {
    *version = 1;
  }
  iVar1 = ebml_read_element_id(this,(uint32_t *)&local_1a8,&local_234);
  local_238 = 0;
  if (-1 < iVar1) {
    local_238 = (uint32_t)local_1a8;
  }
  if ((local_238 != 0x1a45dfa3) || (local_234 != 0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"This is not an EBML file (id=",0x1d);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
    std::__cxx11::stringbuf::str();
    *puVar4 = 900;
    *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
    if (local_1c8 == &local_1b8) {
      puVar4[6] = local_1b8;
      puVar4[7] = uStack_1b4;
      puVar4[8] = uStack_1b0;
      puVar4[9] = uStack_1ac;
    }
    else {
      *(uint **)(puVar4 + 2) = local_1c8;
      *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1b4,local_1b8);
    }
    *(undefined8 *)(puVar4 + 4) = local_1c0;
    local_1c0 = 0;
    local_1b8 = local_1b8 & 0xffffff00;
    local_1c8 = &local_1b8;
    __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  iVar1 = ebml_read_master(this,&local_238);
  if (-1 < iVar1) {
    do {
      iVar1 = ebml_read_element_id(this,(uint32_t *)&local_1a8,&local_234);
      local_238 = 0;
      if (-1 < iVar1) {
        local_238 = (uint32_t)local_1a8;
      }
      if (local_238 == 0) {
        return -1;
      }
      if (local_234 != 0) {
        return 0;
      }
      iVar1 = unaff_R13D;
      if ((int)local_238 < 0x42f2) {
        if (local_238 == 0x4282) {
          iVar2 = ebml_read_ascii(this,&local_238,(char **)&local_1a8);
          if (iVar2 < 0) {
            iVar1 = iVar2;
          }
          if (iVar2 >= 0 && doctype != (char **)0x0) {
            *doctype = (char *)CONCAT44(local_1a8._4_4_,(uint32_t)local_1a8);
            iVar1 = unaff_R13D;
          }
          goto joined_r0x0019c0e0;
        }
        if (local_238 == 0x4285) {
          iVar2 = ebml_read_uint(this,&local_238,&local_1a8);
          if (iVar2 < 0) {
            iVar1 = iVar2;
          }
          if (iVar2 >= 0 && version != (int *)0x0) {
            *version = (uint32_t)local_1a8;
            iVar1 = unaff_R13D;
          }
          goto joined_r0x0019c0e0;
        }
LAB_0019c0e7:
        iVar2 = ebml_read_skip(this);
      }
      else {
        if (local_238 == 0x42f2) {
          iVar2 = ebml_read_uint(this,&local_238,&local_230);
          iVar1 = iVar2;
          if ((-1 < iVar2) && (iVar1 = unaff_R13D, 8 < local_230)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"IDs of size ",0xc);
            poVar3 = std::ostream::_M_insert<long>((long)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," (> 8) not supported",0x14);
            puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar4 = 900;
            *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
            if (local_228 == &local_218) {
              puVar4[6] = local_218;
              puVar4[7] = uStack_214;
              puVar4[8] = uStack_210;
              puVar4[9] = uStack_20c;
            }
            else {
              *(uint **)(puVar4 + 2) = local_228;
              *(ulong *)(puVar4 + 6) = CONCAT44(uStack_214,local_218);
            }
            *(undefined8 *)(puVar4 + 4) = local_220;
            local_220 = 0;
            local_218 = local_218 & 0xffffff00;
            local_228 = &local_218;
            __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
        }
        else if (local_238 == 0x42f3) {
          iVar2 = ebml_read_uint(this,&local_238,&local_230);
          iVar1 = iVar2;
          if ((-1 < iVar2) && (iVar1 = unaff_R13D, 8 < local_230)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"Integers of size ",0x11);
            poVar3 = std::ostream::_M_insert<long>((long)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," (> 8) not supported",0x14);
            puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar4 = 900;
            *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
            if (local_208 == &local_1f8) {
              puVar4[6] = local_1f8;
              puVar4[7] = uStack_1f4;
              puVar4[8] = uStack_1f0;
              puVar4[9] = uStack_1ec;
            }
            else {
              *(uint **)(puVar4 + 2) = local_208;
              *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1f4,local_1f8);
            }
            *(undefined8 *)(puVar4 + 4) = local_200;
            local_200 = 0;
            local_1f8 = local_1f8 & 0xffffff00;
            local_208 = &local_1f8;
            __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
        }
        else {
          if (local_238 != 0x42f7) goto LAB_0019c0e7;
          iVar2 = ebml_read_uint(this,&local_238,&local_230);
          iVar1 = iVar2;
          if ((-1 < iVar2) && (iVar1 = unaff_R13D, 1 < local_230)) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_1a8,"EBML version ",0xd);
            poVar3 = std::ostream::_M_insert<long>((long)&local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," > ",3);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," is not supported",0x11);
            puVar4 = (undefined4 *)__cxa_allocate_exception(0x28);
            std::__cxx11::stringbuf::str();
            *puVar4 = 900;
            *(undefined4 **)(puVar4 + 2) = puVar4 + 6;
            if (local_1e8 == &local_1d8) {
              puVar4[6] = local_1d8;
              puVar4[7] = uStack_1d4;
              puVar4[8] = uStack_1d0;
              puVar4[9] = uStack_1cc;
            }
            else {
              *(uint **)(puVar4 + 2) = local_1e8;
              *(ulong *)(puVar4 + 6) = CONCAT44(uStack_1d4,local_1d8);
            }
            *(undefined8 *)(puVar4 + 4) = local_1e0;
            local_1e0 = 0;
            local_1d8 = local_1d8 & 0xffffff00;
            local_1e8 = &local_1d8;
            __cxa_throw(puVar4,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
          }
        }
joined_r0x0019c0e0:
        unaff_R13D = iVar1;
        if (iVar2 < 0) {
          return unaff_R13D;
        }
      }
      iVar1 = 0;
    } while (iVar2 == 0);
  }
  return iVar1;
}

Assistant:

int MatroskaDemuxer::ebml_read_header(char **doctype, int *version)
{
    uint32_t id;
    int levelUp, res = 0;

    /* default init */
    if (doctype)
        *doctype = nullptr;
    if (version)
        *version = 1;

    if ((id = ebml_peek_id(&levelUp)) == 0 || levelUp != 0 || id != EBML_ID_HEADER)
    {
        THROW(ERR_MATROSKA_PARSE, "This is not an EBML file (id=" << id << "/" << EBML_ID_HEADER)
    }
    if ((res = ebml_read_master(&id)) < 0)
        return res;

    while (res == 0)
    {
        if ((id = ebml_peek_id(&levelUp)) == 0)
            return -BufferedReader::DATA_EOF;

        /* end-of-header */
        if (levelUp)
            break;

        switch (id)
        {
        /* is our read version uptodate? */
        case EBML_ID_EBMLREADVERSION:
        {
            int64_t num;
            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > EBML_VERSION)
            {
                THROW(ERR_MATROSKA_PARSE, "EBML version " << num << " > " << EBML_VERSION << " is not supported")
            }
            break;
        }

        /* we only handle 8 byte lengths at max */
        case EBML_ID_EBMLMAXSIZELENGTH:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > 8)
            {
                THROW(ERR_MATROSKA_PARSE, "Integers of size " << num << " (> 8) not supported")
            }
            break;
        }

        /* we handle 4 byte IDs at max */
        case EBML_ID_EBMLMAXIDLENGTH:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (num > 8)
            {
                THROW(ERR_MATROSKA_PARSE, "IDs of size " << num << " (> 8) not supported")
            }
            break;
        }

        case EBML_ID_DOCTYPE:
        {
            char *text;

            if ((res = ebml_read_ascii(&id, &text)) < 0)
                return res;
            if (doctype)
            {
                *doctype = text;
            }
            break;
        }

        case EBML_ID_DOCTYPEREADVERSION:
        {
            int64_t num;

            if ((res = ebml_read_uint(&id, &num)) < 0)
                return res;
            if (version)
                *version = static_cast<int>(num);
            break;
        }
        /* we ignore these four, as they don't tell us anything we care about */
        case EBML_ID_VOID:
        case EBML_ID_CRC32:
        case EBML_ID_EBMLVERSION:
        case EBML_ID_DOCTYPEVERSION:
            res = ebml_read_skip();
            break;
        default:
            res = ebml_read_skip();
            LTRACE(LT_INFO, 0, "Unknown data type " << id << " in EBML header");
        }
    }

    return 0;
}